

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

uint __thiscall ExpressionContext::GetTypeIndex(ExpressionContext *this,TypeBase *type)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = (this->types).count;
  uVar2 = 0xffffffff;
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      if ((this->types).data[lVar3] == type) {
        uVar2 = (uint)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (uVar1 != (uint)lVar3);
  }
  if (uVar2 == 0xffffffff) {
    __assert_fail("index != ~0u",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x612,"unsigned int ExpressionContext::GetTypeIndex(TypeBase *)");
  }
  return uVar2;
}

Assistant:

unsigned ExpressionContext::GetTypeIndex(TypeBase *type)
{
	unsigned index = ~0u;

	for(unsigned i = 0, e = types.count; i < e; i++)
	{
		if(types.data[i] == type)
		{
			index = i;
			break;
		}
	}

	assert(index != ~0u);

	return index;
}